

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O3

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
AddData<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *this,CordRepBtree *tree,string_view data,size_t extra)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  size_t sVar5;
  long lVar6;
  OpResult OVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  string_view data_00;
  CordRepBtree *this_00;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *pSVar12;
  CordRepBtree *pCVar13;
  CordRepBtree *extra_00;
  long lVar14;
  CordRepBtree *pCVar15;
  Action AVar16;
  CordRepBtree *pCVar17;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *pSVar18;
  CordRepBtree *pCVar19;
  ulong uVar20;
  uint uVar21;
  CordRepBtree *pCVar22;
  uint uVar23;
  int iVar24;
  CordRepBtree *pCVar25;
  undefined8 uVar26;
  CordRepBtree *pCVar27;
  bool bVar28;
  string_view sVar29;
  OpResult OVar30;
  OpResult OVar31;
  OpResult OVar32;
  OpResult OVar33;
  OpResult result;
  OpResult result_00;
  OpResult result_01;
  OpResult result_02;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> ops;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *local_b0;
  char *local_a8;
  uint local_98;
  long alStack_90 [12];
  
  extra_00 = (CordRepBtree *)data._M_str;
  sVar29._M_str = (char *)data._M_len;
  if (tree == (CordRepBtree *)0x0) {
    return this;
  }
  bVar2 = (this->super_CordRep).storage[0];
  pCVar25 = (CordRepBtree *)(ulong)bVar2;
  pCVar19 = (CordRepBtree *)0x0;
  pCVar15 = this;
  do {
    if (pCVar25 == pCVar19) {
      uVar21 = (uint)bVar2;
      pCVar19 = pCVar25;
LAB_0036eee2:
      local_98 = ((pCVar15->super_CordRep).refcount.count_.super___atomic_base<int>._M_i == 2) +
                 uVar21;
      uVar23 = (uint)bVar2;
      pCVar17 = (CordRepBtree *)(ulong)uVar21;
      if ((int)uVar21 <= (int)uVar23) {
        pCVar17 = (CordRepBtree *)(ulong)uVar23;
      }
      goto LAB_0036eefa;
    }
    if ((pCVar15->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2) {
      uVar21 = (uint)pCVar19;
      goto LAB_0036eee2;
    }
    alStack_90[(long)pCVar19] = (long)pCVar15;
    pCVar19 = (CordRepBtree *)((long)&(pCVar19->super_CordRep).length + 1);
    pCVar15 = (CordRepBtree *)pCVar15->edges_[(pCVar15->super_CordRep).storage[1]];
  } while ((pCVar15->super_CordRep).tag == '\x03');
  goto LAB_0036ef16;
  while( true ) {
    alStack_90[(long)pCVar19] = (long)pCVar15;
    pCVar19 = (CordRepBtree *)((long)&(pCVar19->super_CordRep).length + 1);
    pCVar15 = (CordRepBtree *)pCVar15->edges_[(pCVar15->super_CordRep).storage[1]];
    if ((pCVar15->super_CordRep).tag != '\x03') break;
LAB_0036eefa:
    if (pCVar17 == pCVar19) {
      pCVar17 = (CordRepBtree *)(ulong)local_98;
      pCVar19 = this;
      this_00 = tree;
      local_b0 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                 this;
      local_a8 = sVar29._M_str;
      if ((ulong)(pCVar15->super_CordRep).storage[2] - (ulong)(pCVar15->super_CordRep).storage[1] <
          6) {
        if ((int)uVar23 < (int)local_98) {
          uVar26 = 0;
          pCVar17 = pCVar15;
        }
        else {
          sVar5 = (pCVar15->super_CordRep).length;
          pCVar17 = (CordRepBtree *)operator_new(0x40);
          (pCVar17->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          (pCVar17->super_CordRep).length = sVar5;
          *(undefined4 *)((long)pCVar17->edges_ + 0x2c) =
               *(undefined4 *)((long)pCVar15->edges_ + 0x2c);
          uVar26 = *(undefined8 *)&(pCVar15->super_CordRep).tag;
          uVar8 = *(undefined8 *)((long)pCVar15->edges_ + 4);
          uVar9 = *(undefined8 *)((long)pCVar15->edges_ + 0xc);
          uVar10 = *(undefined8 *)((long)pCVar15->edges_ + 0x14);
          uVar11 = *(undefined8 *)((long)pCVar15->edges_ + 0x24);
          *(undefined8 *)((long)pCVar17->edges_ + 0x1c) =
               *(undefined8 *)((long)pCVar15->edges_ + 0x1c);
          *(undefined8 *)((long)pCVar17->edges_ + 0x24) = uVar11;
          *(undefined8 *)((long)pCVar17->edges_ + 0xc) = uVar9;
          *(undefined8 *)((long)pCVar17->edges_ + 0x14) = uVar10;
          *(undefined8 *)&(pCVar17->super_CordRep).tag = uVar26;
          *(undefined8 *)((long)pCVar17->edges_ + 4) = uVar8;
          bVar3 = (pCVar15->super_CordRep).storage[1];
          bVar4 = (pCVar15->super_CordRep).storage[2];
          if (bVar3 != bVar4) {
            lVar14 = (ulong)bVar3 << 3;
            do {
              lVar6 = *(long *)((long)pCVar15->edges_ + lVar14);
              if (lVar6 == 0) {
                __assert_fail("rep != nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                              ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)")
                ;
              }
              LOCK();
              piVar1 = (int *)(lVar6 + 8);
              *piVar1 = *piVar1 + 2;
              UNLOCK();
              lVar14 = lVar14 + 8;
            } while ((ulong)bVar4 * 8 != lVar14);
          }
          uVar26 = 1;
        }
        OVar7._8_8_ = uVar26;
        OVar7.tree = pCVar17;
        sVar29._M_len = (size_t)tree;
        pCVar15 = extra_00;
        sVar29 = AddData<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                           (pCVar17,sVar29,(size_t)extra_00);
        this_00 = (CordRepBtree *)sVar29._M_len;
        if (this_00 == (CordRepBtree *)0x0) {
          (pCVar17->super_CordRep).length =
               (size_t)((tree->super_CordRep).storage + ((pCVar17->super_CordRep).length - 0xd));
          OVar31._8_8_ = uVar26;
          OVar31.tree = pCVar17;
          if (pCVar25 == (CordRepBtree *)0x0) {
LAB_0036f102:
            tree = pCVar15;
            result_00.tree = OVar31._8_8_;
            result_00._8_8_ = tree;
            pCVar19 = anon_unknown_0::
                      StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                      ::Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                  *)this,OVar31.tree,result_00);
          }
          else {
            uVar20 = (ulong)(bVar2 - 1);
            pCVar17 = pCVar25;
            OVar31 = OVar7;
            while( true ) {
              uVar20 = uVar20 - 1;
              pCVar19 = (CordRepBtree *)alStack_90[(long)((long)pCVar17[-1].edges_ + 0x2f)];
              AVar16 = OVar31.action;
              if (AVar16 != kCopied) break;
              pCVar15 = tree;
              OVar31 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                 (pCVar19,(long)pCVar17 <= (long)(int)local_98,
                                  &(OVar31.tree)->super_CordRep,(size_t)tree);
LAB_0036f0f2:
              bVar28 = (long)pCVar17 < 2;
              pCVar17 = (CordRepBtree *)((long)pCVar17[-1].edges_ + 0x2f);
              if (bVar28) goto LAB_0036f102;
            }
            if (AVar16 == kPopped) {
              pCVar15 = tree;
              OVar31 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                 (pCVar19,(long)pCVar17 <= (long)(int)local_98,
                                  &(OVar31.tree)->super_CordRep,(size_t)tree);
              goto LAB_0036f0f2;
            }
            if (AVar16 != kSelf) goto LAB_0036f0f2;
            (pCVar19->super_CordRep).length =
                 (size_t)((tree->super_CordRep).storage + ((pCVar19->super_CordRep).length - 0xd));
            if (1 < (long)pCVar17) {
              do {
                pCVar19 = (CordRepBtree *)alStack_90[uVar20 & 0xffffffff];
                (pCVar19->super_CordRep).length =
                     (size_t)((tree->super_CordRep).storage +
                             ((pCVar19->super_CordRep).length - 0xd));
                uVar21 = (int)pCVar17 - 1;
                pCVar17 = (CordRepBtree *)(ulong)uVar21;
                uVar20 = uVar20 - 1;
              } while (1 < (int)uVar21);
            }
          }
        }
        else {
          pCVar19 = (CordRepBtree *)((long)tree - (long)this_00);
          if (pCVar19 == (CordRepBtree *)0x0) {
            __assert_fail("delta > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x279,
                          "static CordRepBtree *absl::cord_internal::CordRepBtree::AddData(CordRepBtree *, absl::string_view, size_t) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                         );
          }
          (pCVar17->super_CordRep).length =
               (size_t)((pCVar19->super_CordRep).storage + ((pCVar17->super_CordRep).length - 0xd));
          OVar30._8_8_ = uVar26;
          OVar30.tree = pCVar17;
          pCVar17 = this;
          if (pCVar25 == (CordRepBtree *)0x0) {
LAB_0036f068:
            result.tree = OVar30._8_8_;
            result._8_8_ = pCVar15;
            pSVar12 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                       *)anon_unknown_0::
                         StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         ::Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     *)this,OVar30.tree,result);
            tree = pCVar15;
            pCVar19 = pCVar17;
          }
          else {
            uVar20 = (ulong)(bVar2 - 1);
            pCVar22 = pCVar25;
            OVar30 = OVar7;
            while( true ) {
              uVar20 = uVar20 - 1;
              pSVar12 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)alStack_90[(long)((long)pCVar22[-1].edges_ + 0x2f)];
              AVar16 = OVar30.action;
              if (AVar16 != kCopied) break;
              pCVar15 = pCVar19;
              OVar30 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                 ((CordRepBtree *)pSVar12,(long)pCVar22 <= (long)(int)local_98,
                                  &(OVar30.tree)->super_CordRep,(size_t)pCVar19);
              alStack_90[(long)((long)pCVar22[-1].edges_ + 0x2f)] = (long)OVar30.tree;
LAB_0036f058:
              bVar28 = (long)pCVar22 < 2;
              pCVar17 = pCVar19;
              pCVar22 = (CordRepBtree *)((long)pCVar22[-1].edges_ + 0x2f);
              if (bVar28) goto LAB_0036f068;
            }
            if (AVar16 != kSelf) {
              if (AVar16 == kPopped) {
                __assert_fail("!propagate",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                              ,0x145,
                              "CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::Unwind(CordRepBtree *, int, size_t, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront, propagate = true]"
                             );
              }
              goto LAB_0036f058;
            }
            *(uint8_t **)pSVar12 = (pCVar19->super_CordRep).storage + *(long *)pSVar12 + -0xd;
            tree = pCVar15;
            if (1 < (long)pCVar22) {
              do {
                pSVar12 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                           *)alStack_90[uVar20 & 0xffffffff];
                *(uint8_t **)pSVar12 = (pCVar19->super_CordRep).storage + *(long *)pSVar12 + -0xd;
                uVar21 = (int)pCVar22 - 1;
                pCVar22 = (CordRepBtree *)(ulong)uVar21;
                uVar20 = uVar20 - 1;
              } while (1 < (int)uVar21);
            }
          }
          local_98 = bVar2 + 1;
          this = (CordRepBtree *)pSVar12;
        }
        local_a8 = sVar29._M_str;
        pCVar17 = tree;
        local_b0 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                   this;
        if (this_00 == (CordRepBtree *)0x0) {
          return pCVar19;
        }
      }
      do {
        data_00._M_str = (char *)extra_00;
        data_00._M_len = (size_t)local_a8;
        pCVar13 = NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                            (this_00,data_00,(size_t)pCVar17);
        pCVar15 = (CordRepBtree *)(pCVar13->super_CordRep).length;
        pCVar22 = (CordRepBtree *)((long)this_00 - (long)pCVar15);
        iVar24 = (int)pCVar25;
        if (pCVar22 == (CordRepBtree *)0x0) {
          if (iVar24 == 0) {
            OVar32._8_8_ = 2;
            OVar32.tree = pCVar13;
          }
          else {
            uVar20 = (ulong)(iVar24 - 1);
            OVar32._8_8_ = 2;
            OVar32.tree = pCVar13;
            pCVar13 = pCVar25;
            pCVar27 = pCVar25;
            do {
              uVar20 = uVar20 - 1;
              pCVar19 = (CordRepBtree *)alStack_90[(long)((long)pCVar27[-1].edges_ + 0x2f)];
              AVar16 = OVar32.action;
              if (AVar16 == kCopied) {
                OVar32 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                   (pCVar19,(long)pCVar27 <= (long)(int)local_98,
                                    &(OVar32.tree)->super_CordRep,(size_t)this_00);
              }
              else if (AVar16 == kPopped) {
                OVar32 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                   (pCVar19,(long)pCVar27 <= (long)(int)local_98,
                                    &(OVar32.tree)->super_CordRep,(size_t)this_00);
              }
              else if (AVar16 == kSelf) {
                (pCVar19->super_CordRep).length =
                     (size_t)((this_00->super_CordRep).storage +
                             ((pCVar19->super_CordRep).length - 0xd));
                pCVar22 = this_00;
                if ((CordRepBtree *)0x1 < pCVar27) {
                  do {
                    pCVar19 = (CordRepBtree *)alStack_90[uVar20 & 0xffffffff];
                    (pCVar19->super_CordRep).length =
                         (size_t)((this_00->super_CordRep).storage +
                                 ((pCVar19->super_CordRep).length - 0xd));
                    uVar21 = (int)pCVar13 - 1;
                    pCVar13 = (CordRepBtree *)(ulong)uVar21;
                    uVar20 = uVar20 - 1;
                  } while (1 < (int)uVar21);
                }
                goto LAB_0036f2fa;
              }
              pCVar13 = (CordRepBtree *)(ulong)((int)pCVar13 - 1);
              bVar28 = (CordRepBtree *)0x1 < pCVar27;
              pCVar17 = pCVar27;
              pCVar27 = (CordRepBtree *)((long)pCVar27[-1].edges_ + 0x2f);
            } while (bVar28);
          }
          result_01.tree = OVar32._8_8_;
          result_01._8_8_ = pCVar17;
          pCVar19 = anon_unknown_0::
                    StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
                    Finalize(local_b0,OVar32.tree,result_01);
          pCVar22 = this_00;
        }
        else {
          if (this_00 < pCVar22) {
            pCVar22 = this_00;
          }
          if (iVar24 == 0) {
            OVar33._8_8_ = 2;
            OVar33.tree = pCVar13;
          }
          else {
            uVar20 = (ulong)(iVar24 - 1);
            OVar33._8_8_ = 2;
            OVar33.tree = pCVar13;
            pCVar13 = pCVar25;
            do {
              pCVar17 = pCVar13;
              uVar20 = uVar20 - 1;
              pSVar12 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)alStack_90[(long)((long)pCVar17[-1].edges_ + 0x2f)];
              AVar16 = OVar33.action;
              if (AVar16 == kCopied) {
                OVar33 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                   ((CordRepBtree *)pSVar12,(long)pCVar17 <= (long)(int)local_98,
                                    &(OVar33.tree)->super_CordRep,(size_t)pCVar15);
              }
              else if (AVar16 == kPopped) {
                OVar33 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                   ((CordRepBtree *)pSVar12,(long)pCVar17 <= (long)(int)local_98,
                                    &(OVar33.tree)->super_CordRep,(size_t)pCVar15);
              }
              else if (AVar16 == kSelf) {
                *(uint8_t **)pSVar12 = (pCVar15->super_CordRep).storage + *(long *)pSVar12 + -0xd;
                if ((CordRepBtree *)0x1 < pCVar17) {
                  do {
                    pSVar12 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                               *)alStack_90[uVar20 & 0xffffffff];
                    *(uint8_t **)pSVar12 =
                         (pCVar15->super_CordRep).storage + *(long *)pSVar12 + -0xd;
                    uVar21 = (int)pCVar25 - 1;
                    pCVar25 = (CordRepBtree *)(ulong)uVar21;
                    uVar20 = uVar20 - 1;
                  } while (1 < (int)uVar21);
                }
                goto LAB_0036f296;
              }
              pCVar25 = (CordRepBtree *)(ulong)((int)pCVar25 - 1);
              pCVar13 = (CordRepBtree *)((long)pCVar17[-1].edges_ + 0x2f);
            } while ((CordRepBtree *)0x1 < pCVar17);
          }
          result_02.tree = OVar33._8_8_;
          result_02._8_8_ = pCVar17;
          pSVar12 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *
                    )anon_unknown_0::
                     StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
                     Finalize(local_b0,OVar33.tree,result_02);
LAB_0036f296:
          bVar2 = *(uint8_t *)((long)((RefcountAndFlags *)pSVar12->stack + 1) + 1);
          pCVar25 = (CordRepBtree *)(ulong)bVar2;
          if (0xb < bVar2) {
            __assert_fail("height <= CordRepBtree::kMaxHeight",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x103,
                          "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                         );
          }
          pCVar17 = (CordRepBtree *)0x0;
          pSVar18 = pSVar12;
          while (iVar24 = (((RefcountAndFlags *)pSVar18->stack)->count_).super___atomic_base<int>.
                          _M_i, (CordRepBtree *)(ulong)(uint)bVar2 != pCVar17) {
            if (iVar24 != 2) {
              __assert_fail("tree->refcount.IsOne()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                            ,0x106,
                            "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                           );
            }
            alStack_90[(long)pCVar17] = (long)pSVar18;
            pCVar17 = (CordRepBtree *)((long)&(pCVar17->super_CordRep).length + 1);
            pSVar18 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                        **)((RefcountAndFlags *)pSVar18->stack +
                           (ulong)*(uint8_t *)((long)((RefcountAndFlags *)pSVar18->stack + 1) + 2) *
                           2 + 2);
            if (*(uint8_t *)((RefcountAndFlags *)pSVar18->stack + 1) != '\x03') goto LAB_0036ef16;
          }
          if (iVar24 != 2) {
            __assert_fail("tree->refcount.IsOne()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x10a,
                          "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                         );
          }
          local_98 = bVar2 + 1;
          local_b0 = pSVar12;
        }
LAB_0036f2fa:
        bVar28 = this_00 == pCVar15;
        this_00 = pCVar22;
        if (bVar28) {
          return pCVar19;
        }
      } while( true );
    }
  }
LAB_0036ef16:
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
}

Assistant:

CordRepBtree* CordRepBtree::AddData(CordRepBtree* tree, absl::string_view data,
                                    size_t extra) {
  if (ABSL_PREDICT_FALSE(data.empty())) return tree;

  const size_t original_data_size = data.size();
  int depth = tree->height();
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);

  // If there is capacity in the last edge, append as much data
  // as possible into this last edge.
  if (leaf->size() < leaf->capacity()) {
    OpResult result = leaf->ToOpResult(ops.owned(depth));
    data = result.tree->AddData<edge_type>(data, extra);
    if (data.empty()) {
      result.tree->length += original_data_size;
      return ops.Unwind(tree, depth, original_data_size, result);
    }

    // We added some data into this leaf, but not all. Propagate the added
    // length to the top most node, and rebuild the stack with any newly copied
    // or updated nodes. From this point on, the path (leg) from the top most
    // node to the right-most node towards the leaf node is privately owned.
    size_t delta = original_data_size - data.size();
    assert(delta > 0);
    result.tree->length += delta;
    tree = ops.Propagate(tree, depth, delta, result);
    ops.share_depth = depth + 1;
  }

  // We were unable to append all data into the existing right-most leaf node.
  // This means all remaining data must be put into (a) new leaf node(s) which
  // we append to the tree. To make this efficient, we iteratively build full
  // leaf nodes from `data` until the created leaf contains all remaining data.
  // We utilize the `Unwind` method to merge the created leaf into the first
  // level towards root that has capacity. On each iteration with remaining
  // data, we rebuild the stack in the knowledge that right-most nodes are
  // privately owned after the first `Unwind` completes.
  for (;;) {
    OpResult result = {CordRepBtree::NewLeaf<edge_type>(data, extra), kPopped};
    if (result.tree->length == data.size()) {
      return ops.Unwind(tree, depth, result.tree->length, result);
    }
    data = Consume<edge_type>(data, result.tree->length);
    tree = ops.Unwind(tree, depth, result.tree->length, result);
    depth = tree->height();
    ops.BuildOwnedStack(tree, depth);
  }
}